

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall cmFileCopier::SetPermissions(cmFileCopier *this,char *toFile,mode_t permissions)

{
  cmCommand *this_00;
  bool bVar1;
  ostream *poVar2;
  bool bVar3;
  ostringstream e;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  bVar3 = true;
  if (permissions != 0) {
    bVar1 = cmsys::SystemTools::SetPermissions(toFile,permissions,false);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      poVar2 = std::operator<<((ostream *)local_198,this->Name);
      poVar2 = std::operator<<(poVar2," cannot set permissions on \"");
      poVar2 = std::operator<<(poVar2,toFile);
      std::operator<<(poVar2,"\"");
      this_00 = &this->FileCommand->super_cmCommand;
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(this_00,&sStack_1b8);
      std::__cxx11::string::~string((string *)&sStack_1b8);
      std::__cxx11::ostringstream::~ostringstream(local_198);
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool SetPermissions(const char* toFile, mode_t permissions)
    {
    if(permissions && !cmSystemTools::SetPermissions(toFile, permissions))
      {
      std::ostringstream e;
      e << this->Name << " cannot set permissions on \"" << toFile << "\"";
      this->FileCommand->SetError(e.str());
      return false;
      }
    return true;
    }